

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.hpp
# Opt level: O3

void __thiscall
FunctionDeclarationNode::FunctionDeclarationNode
          (FunctionDeclarationNode *this,string *name,TypeName *returnType,
          list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
          *args,unique_ptr<BlockNode,_std::default_delete<BlockNode>_> *body)

{
  pointer pcVar1;
  
  (this->super_StatementNode).super_Node.mark_.line = 1;
  (this->super_StatementNode).super_Node.mark_.column = 0;
  (this->super_StatementNode).super_Node._vptr_Node =
       (_func_int **)&PTR__FunctionDeclarationNode_001ea078;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name_,pcVar1,pcVar1 + name->_M_string_length);
  this->returnType_ = *returnType;
  std::__cxx11::
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
  ::list(&this->arguments_,args);
  std::__shared_ptr<BlockNode,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<BlockNode,std::default_delete<BlockNode>,void>
            ((__shared_ptr<BlockNode,(__gnu_cxx::_Lock_policy)2> *)&this->body_,body);
  return;
}

Assistant:

FunctionDeclarationNode(const std::string& name, const TypeName& returnType, 
    const std::list<std::pair<std::string, TypeName>> args, std::unique_ptr<BlockNode> body):
      name_(name), returnType_(returnType), arguments_(args), body_(std::move(body)) {}